

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astMessageChainNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  ulong uVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t sVar5;
  undefined8 uVar6;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_f8;
  sysbvm_tuple_t local_f0;
  sysbvm_tuple_t local_e8;
  sysbvm_tuple_t local_e0;
  sysbvm_tuple_t local_d8;
  sysbvm_tuple_t local_d0;
  sysbvm_tuple_t *local_c8;
  sysbvm_tuple_t local_c0;
  sysbvm_tuple_t local_b8;
  sysbvm_tuple_t local_b0;
  sysbvm_tuple_t local_a8;
  sysbvm_tuple_t local_a0;
  sysbvm_tuple_t local_98;
  sysbvm_tuple_t local_90;
  sysbvm_tuple_t local_88;
  sysbvm_tuple_t local_80;
  sysbvm_tuple_t local_78;
  sysbvm_stackFrameRecord_t local_70;
  undefined8 local_60;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  undefined1 *local_40;
  sysbvm_tuple_t *local_38;
  sysbvm_tuple_t local_30;
  sysbvm_tuple_t local_28;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  sVar5 = 0;
  memset(&local_f8,0,0x88);
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 0x11;
  local_40 = (undefined1 *)&local_f8;
  sysbvm_stackFrame_pushRecord(&local_58);
  local_f8 = sysbvm_context_shallowCopy(context,*arguments);
  sVar2 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  *(sysbvm_tuple_t *)(local_f8 + 0x18) = sVar2;
  local_70.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_70.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_60 = *(undefined8 *)(local_f8 + 0x10);
  sysbvm_stackFrame_pushRecord(&local_70);
  uVar3 = *(ulong *)(local_f8 + 0x38);
  if ((uVar3 & 0xf) == 0 && uVar3 != 0) {
    sVar5 = (sysbvm_tuple_t)(*(uint *)(uVar3 + 0xc) >> 3);
  }
  if (*(sysbvm_tuple_t *)(local_f8 + 0x28) != 0) {
    local_f0 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                         (context,*(sysbvm_tuple_t *)(local_f8 + 0x28),
                          (context->roots).directTypeInferenceType,arguments[1]);
    *(sysbvm_tuple_t *)(local_f8 + 0x28) = local_f0;
    _Var1 = sysbvm_astNode_isTupleWithLookupStartingFromNode(context,local_f0);
    if (_Var1) {
      uVar3 = *(ulong *)(local_f0 + 0x28);
      *(ulong *)(local_f8 + 0x28) = uVar3;
      local_e8 = *(sysbvm_tuple_t *)(local_f0 + 0x30);
      *(sysbvm_tuple_t *)(local_f8 + 0x30) = local_e8;
      local_f0 = uVar3;
    }
    if (local_f0 == 0 || (local_f0 & 0xf) != 0) {
      local_c8 = (sysbvm_tuple_t *)0x0;
    }
    else {
      local_c8 = *(sysbvm_tuple_t **)(local_f0 + 0x20);
      if ((local_c8 != (sysbvm_tuple_t *)0x0) &&
         (_Var1 = sysbvm_astNode_isLiteralNode(context,*(sysbvm_tuple_t *)(local_f8 + 0x28)), _Var1)
         ) {
        uVar3 = (ulong)local_c8 & 0xf;
        if (uVar3 == 0 && local_c8 != (sysbvm_tuple_t *)0x0) {
          local_c0 = *local_c8;
        }
        else if ((int)uVar3 == 0xf) {
          local_c0 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)local_c8 >> 4);
        }
        else {
          local_c0 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar3);
        }
        local_b8 = sysbvm_type_getAnalyzeMessageChainNodeWithEnvironmentFunction(context,local_c0);
        if (local_b8 != 0) {
          sysbvm_stackFrame_popRecord(&local_70);
          sysbvm_stackFrame_popRecord(&local_58);
          local_28 = arguments[1];
          local_38 = local_c8;
          local_30 = local_f8;
          sVar2 = sysbvm_function_apply(context,local_b8,3,(sysbvm_tuple_t *)&local_38,0);
          return sVar2;
        }
      }
    }
    if ((int)sVar5 == 1) {
      uVar3 = *(ulong *)(local_f8 + 0x38);
      if ((uVar3 & 0xf) == 0 && uVar3 != 0) {
        local_d0 = *(sysbvm_tuple_t *)(uVar3 + 0x10);
      }
      else {
        local_d0 = 0;
      }
      local_90 = sysbvm_astMessageChainMessageNode_expandToMessageWithReceiver
                           (context,local_d0,local_f0,local_e8);
      sysbvm_stackFrame_popRecord(&local_70);
      sysbvm_stackFrame_popRecord(&local_58);
      sVar2 = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
                        (context,local_f0,arguments[1]);
      return sVar2;
    }
    if (sVar5 == 0) {
      sysbvm_stackFrame_popRecord(&local_70);
      sysbvm_stackFrame_popRecord(&local_58);
      return local_f0;
    }
    _Var1 = sysbvm_astNode_isLiteralNode(context,local_f0);
    if (_Var1) {
      local_a0 = local_f0;
      local_98 = local_f0;
    }
    else {
      if ((local_f0 & 0xf) == 0 && local_f0 != 0) {
        local_b0 = *(sysbvm_tuple_t *)(local_f0 + 0x10);
      }
      else {
        local_b0 = 0;
      }
      sVar2 = sysbvm_symbol_internWithCString(context,"<messageChainReceiver>");
      local_a8 = sysbvm_generatedSymbol_create(context,sVar2,local_b0);
      sVar2 = local_b0;
      sVar4 = sysbvm_astLiteralNode_create(context,local_b0,local_a8);
      sVar2 = sysbvm_astVariableDefinitionNode_create(context,sVar2,sVar4,0,local_f0,false);
      *(sysbvm_tuple_t **)(sVar2 + 0x20) = local_c8;
      local_a0 = sVar2;
      sVar4 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1])
      ;
      *(sysbvm_tuple_t *)(sVar2 + 0x18) = sVar4;
      sVar4 = sysbvm_analysisEnvironment_setNewSymbolLocalBinding
                        (context,arguments[1],local_b0,local_a8,(sysbvm_tuple_t)local_c8);
      *(sysbvm_tuple_t *)(sVar2 + 0x40) = sVar4;
      local_98 = sysbvm_astIdentifierReferenceNode_create(context,local_b0,local_a8);
    }
  }
  local_e0 = sysbvm_array_create(context,sVar5);
  *(undefined8 *)(local_f8 + 0x20) = 0;
  if (sVar5 != 0) {
    sVar2 = 0;
    do {
      uVar3 = *(ulong *)(local_f8 + 0x38);
      if ((uVar3 & 0xf) == 0 && uVar3 != 0) {
        local_d0 = *(sysbvm_tuple_t *)(uVar3 + 0x10 + sVar2 * 8);
      }
      else {
        local_d0 = 0;
      }
      local_d8 = sysbvm_astMessageChainMessageNode_expandToMessageWithReceiver
                           (context,local_d0,local_98,local_e8);
      if ((local_e0 & 0xf) == 0 && local_e0 != 0) {
        *(sysbvm_tuple_t *)(local_e0 + 0x10 + sVar2 * 8) = local_d8;
      }
      sVar2 = sVar2 + 1;
    } while (sVar5 != sVar2);
  }
  sVar2 = *(sysbvm_tuple_t *)(local_f8 + 0x10);
  sVar5 = sysbvm_array_create(context,0);
  local_90 = sysbvm_astSequenceNode_create(context,sVar2,sVar5,local_e0);
  local_80 = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
                       (context,local_90,arguments[1]);
  local_78 = local_80;
  if (local_a0 != local_98) {
    local_88 = sysbvm_array_create(context,2);
    if ((local_88 & 0xf) == 0 && local_88 != 0) {
      *(sysbvm_tuple_t *)(local_88 + 0x10) = local_a0;
    }
    if ((local_88 & 0xf) == 0 && local_88 != 0) {
      *(sysbvm_tuple_t *)(local_88 + 0x18) = local_80;
    }
    sVar2 = *(sysbvm_tuple_t *)(local_f8 + 0x10);
    uVar6 = 0;
    sVar5 = sysbvm_array_create(context,0);
    local_78 = sysbvm_astSequenceNode_create(context,sVar2,sVar5,local_88);
    if ((local_80 & 0xf) == 0 && local_80 != 0) {
      uVar6 = *(undefined8 *)(local_80 + 0x20);
    }
    *(undefined8 *)(local_78 + 0x20) = uVar6;
    sVar2 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
    *(sysbvm_tuple_t *)(local_78 + 0x18) = sVar2;
  }
  sysbvm_stackFrame_popRecord(&local_70);
  sysbvm_stackFrame_popRecord(&local_58);
  return local_78;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMessageChainNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astMessageChainNode_t *chainNode;
        sysbvm_tuple_t analyzedReceiver;
        sysbvm_tuple_t analyzedReceiverTypeExpression;
        sysbvm_tuple_t expandedChainedMessages;
        sysbvm_tuple_t expandedChainedMessageNode;
        sysbvm_tuple_t chainedMessageNode;

        sysbvm_tuple_t receiverType;
        sysbvm_tuple_t receiverMetaType;
        sysbvm_tuple_t analysisFunction;

        sysbvm_tuple_t receiverSourcePosition;
        sysbvm_tuple_t expansionReceiverSymbol;
        sysbvm_tuple_t expansionReceiverExpression;
        sysbvm_tuple_t expansionReceiverIdentifier;
        sysbvm_tuple_t expansionMessageSequence;
        sysbvm_tuple_t expansionLocalAndMessageSequenceArray;

        sysbvm_tuple_t analyzedExpandedChainedMessages;
        sysbvm_tuple_t analyzedExpansion;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    
    gcFrame.chainNode = (sysbvm_astMessageChainNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.chainNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.chainNode->super.sourcePosition);

    size_t chainedMessageCount = sysbvm_array_getSize(gcFrame.chainNode->messages);

    if(gcFrame.chainNode->receiver)
    {
        gcFrame.analyzedReceiver = sysbvm_interpreter_analyzeASTWithDirectTypeWithEnvironment(context, gcFrame.chainNode->receiver, *environment);
        gcFrame.chainNode->receiver = gcFrame.analyzedReceiver;

        // Inline the object with lookup starting from node.
        if(sysbvm_astNode_isTupleWithLookupStartingFromNode(context, gcFrame.analyzedReceiver))
        {
            sysbvm_astTupleWithLookupStartingFromNode_t *objectLookup = (sysbvm_astTupleWithLookupStartingFromNode_t*)gcFrame.analyzedReceiver;
            gcFrame.analyzedReceiver = objectLookup->tupleExpression;
            gcFrame.chainNode->receiver = gcFrame.analyzedReceiver;
            
            gcFrame.analyzedReceiverTypeExpression = objectLookup->typeExpression;
            gcFrame.chainNode->receiverLookupType = gcFrame.analyzedReceiverTypeExpression;
        }

        gcFrame.receiverType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedReceiver);
        // HACK: remove this literal check when properly implementing this analysis in the target system.
        if(gcFrame.receiverType && sysbvm_astNode_isLiteralNode(context, gcFrame.chainNode->receiver))
        {
            gcFrame.receiverMetaType = sysbvm_tuple_getType(context, gcFrame.receiverType);
            gcFrame.analysisFunction = sysbvm_type_getAnalyzeMessageChainNodeWithEnvironmentFunction(context, gcFrame.receiverMetaType);
            if(gcFrame.analysisFunction)
            {
                SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
                SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
                return sysbvm_function_apply3(context, gcFrame.analysisFunction, gcFrame.receiverType, (sysbvm_tuple_t)gcFrame.chainNode, *environment);
            }
        }

        // Simple cases.
        if(chainedMessageCount == 0)
        {
            SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            return gcFrame.analyzedReceiver;
        }
        else if(chainedMessageCount == 1)
        {
            gcFrame.chainedMessageNode = sysbvm_array_at(gcFrame.chainNode->messages, 0);
            gcFrame.expansionMessageSequence = sysbvm_astMessageChainMessageNode_expandToMessageWithReceiver(context, gcFrame.chainedMessageNode, gcFrame.analyzedReceiver, gcFrame.analyzedReceiverTypeExpression);
            SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            return sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.analyzedReceiver, *environment);
        }

        // Do we need to define a variable for the receiver?
        if(sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedReceiver))
        {
            gcFrame.expansionReceiverExpression = gcFrame.analyzedReceiver;
            gcFrame.expansionReceiverIdentifier = gcFrame.analyzedReceiver;
        }
        else
        {
            gcFrame.receiverSourcePosition = sysbvm_astNode_getSourcePosition(gcFrame.analyzedReceiver);
            gcFrame.expansionReceiverSymbol = sysbvm_generatedSymbol_create(context, sysbvm_symbol_internWithCString(context, "<messageChainReceiver>"), gcFrame.receiverSourcePosition);

            gcFrame.expansionReceiverExpression = sysbvm_astVariableDefinitionNode_create(context, gcFrame.receiverSourcePosition, sysbvm_astLiteralNode_create(context, gcFrame.receiverSourcePosition, gcFrame.expansionReceiverSymbol), SYSBVM_NULL_TUPLE, gcFrame.analyzedReceiver, false);
            sysbvm_astVariableDefinitionNode_t *receiverLocalDefinition = (sysbvm_astVariableDefinitionNode_t *)gcFrame.expansionReceiverExpression;
            receiverLocalDefinition->super.analyzedType = gcFrame.receiverType;
            receiverLocalDefinition->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
            receiverLocalDefinition->binding = sysbvm_analysisEnvironment_setNewSymbolLocalBinding(context, *environment, gcFrame.receiverSourcePosition, gcFrame.expansionReceiverSymbol, gcFrame.receiverType);

            gcFrame.expansionReceiverIdentifier = sysbvm_astIdentifierReferenceNode_create(context, gcFrame.receiverSourcePosition, gcFrame.expansionReceiverSymbol);
        }
    }

    // Message sequence.
    gcFrame.expandedChainedMessages = sysbvm_array_create(context, chainedMessageCount);
    gcFrame.chainNode->super.analyzedType = SYSBVM_NULL_TUPLE;
    for(size_t i = 0; i < chainedMessageCount; ++i)
    {
        gcFrame.chainedMessageNode = sysbvm_array_at(gcFrame.chainNode->messages, i);
        gcFrame.expandedChainedMessageNode = sysbvm_astMessageChainMessageNode_expandToMessageWithReceiver(context, gcFrame.chainedMessageNode, gcFrame.expansionReceiverIdentifier, gcFrame.analyzedReceiverTypeExpression);
        sysbvm_array_atPut(gcFrame.expandedChainedMessages, i, gcFrame.expandedChainedMessageNode);
    }
    gcFrame.expansionMessageSequence = sysbvm_astSequenceNode_create(context, gcFrame.chainNode->super.sourcePosition, sysbvm_array_create(context, 0), gcFrame.expandedChainedMessages);
    gcFrame.analyzedExpandedChainedMessages = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.expansionMessageSequence, *environment);

    // Local definition and message sequence.
    gcFrame.analyzedExpansion = gcFrame.analyzedExpandedChainedMessages;
    if(gcFrame.expansionReceiverExpression != gcFrame.expansionReceiverIdentifier)
    {
        gcFrame.expansionLocalAndMessageSequenceArray = sysbvm_array_create(context, 2);
        sysbvm_array_atPut(gcFrame.expansionLocalAndMessageSequenceArray, 0, gcFrame.expansionReceiverExpression);
        sysbvm_array_atPut(gcFrame.expansionLocalAndMessageSequenceArray, 1, gcFrame.analyzedExpandedChainedMessages);

        gcFrame.analyzedExpansion = sysbvm_astSequenceNode_create(context, gcFrame.chainNode->super.sourcePosition, sysbvm_array_create(context, 0), gcFrame.expansionLocalAndMessageSequenceArray);
        ((sysbvm_astNode_t*)gcFrame.analyzedExpansion)->analyzedType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedExpandedChainedMessages);
        ((sysbvm_astNode_t*)gcFrame.analyzedExpansion)->analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    }
    
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.analyzedExpansion;
}